

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatCopy(SUNMatrix A,int myid)

{
  uint uVar1;
  undefined8 uVar2;
  uint in_ESI;
  SUNMatrix in_RDI;
  double dVar3;
  double dVar4;
  sunrealtype tol;
  SUNMatrix B;
  double stop_time;
  double start_time;
  int failure;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar5;
  
  uVar2 = SUNMatClone(in_RDI);
  dVar3 = get_time();
  uVar1 = SUNMatCopy(in_RDI,uVar2);
  sync_device(in_RDI);
  dVar4 = get_time();
  if (uVar1 == 0) {
    iVar5 = check_matrix(B,(SUNMatrix)tol,
                         (sunrealtype)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
    ;
    if (iVar5 == 0) {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf("    PASSED test -- SUNMatCopy \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf("    PASSED test -- SUNMatCopy \n");
      }
      if ((in_ESI == 0) && (print_time != 0)) {
        printf("    SUNMatCopy Time: %22.15e \n \n",dVar4 - dVar3);
      }
      SUNMatDestroy(uVar2);
      iVar5 = 0;
    }
    else {
      if ((print_all_ranks == 0) && (in_ESI == 0)) {
        printf(">>> FAILED test -- SUNMatCopy \n");
      }
      else if (print_all_ranks != 0) {
        printf("process %06d: ",(ulong)in_ESI);
        printf(">>> FAILED test -- SUNMatCopy \n");
      }
      if (print_time != 0) {
        printf("    SUNMatCopy Time: %22.15e \n \n",dVar4 - dVar3);
      }
      SUNMatDestroy(uVar2);
      iVar5 = 1;
    }
  }
  else {
    if ((print_all_ranks == 0) && (in_ESI == 0)) {
      printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)in_ESI);
      printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    }
    SUNMatDestroy(uVar2);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Test_SUNMatCopy(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  B = SUNMatClone(A);

  /* copy matrix data */
  start_time = get_time();
  failure    = SUNMatCopy(A, B);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix entries */
  failure = check_matrix(B, A, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatCopy \n", myid);
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatCopy \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}